

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::selectMimeTypeFilter(QFileDialog *this,QString *filter)

{
  QFileDialogPrivate *this_00;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QFileDialogOptions::setInitiallySelectedMimeTypeFilter((QString *)(this_00->options).value.ptr);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  nameFilterForMime((QString *)&local_38,filter);
  if (((this_00->super_QDialogPrivate).nativeDialogInUse != false) ||
     (puVar1 = (undefined1 *)local_38.size, (this_00->qFileDialogUi).d == (Ui_QFileDialog *)0x0)) {
    QFileDialogPrivate::selectMimeTypeFilter_sys(this_00,filter);
    QFileDialogPrivate::selectedMimeTypeFilter_sys((QString *)&local_50,this_00);
    puVar1 = (undefined1 *)local_38.size;
    if (local_50.size != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      goto LAB_0049c0b7;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (puVar1 != (undefined1 *)0x0) {
    selectNameFilter(this,(QString *)&local_38);
  }
LAB_0049c0b7:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::selectMimeTypeFilter(const QString &filter)
{
    Q_D(QFileDialog);
    d->options->setInitiallySelectedMimeTypeFilter(filter);

    const QString filterForMime = nameFilterForMime(filter);

    if (!d->usingWidgets()) {
        d->selectMimeTypeFilter_sys(filter);
        if (d->selectedMimeTypeFilter_sys().isEmpty() && !filterForMime.isEmpty()) {
            selectNameFilter(filterForMime);
        }
    } else if (!filterForMime.isEmpty()) {
        selectNameFilter(filterForMime);
    }
}